

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc16.cpp
# Opt level: O1

void __thiscall ot::commissioner::Crc16::Update(Crc16 *this,uint8_t aByte)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  
  uVar2 = (ushort)aByte << 8 ^ this->mCrc;
  uVar3 = (uint)uVar2;
  this->mCrc = uVar2;
  cVar1 = -8;
  do {
    uVar3 = (int)(short)uVar3 >> 0xf & (uint)this->mPolynomial ^ uVar3 * 2;
    cVar1 = cVar1 + '\x01';
  } while (cVar1 != '\0');
  this->mCrc = (uint16_t)uVar3;
  return;
}

Assistant:

void Crc16::Update(uint8_t aByte)
{
    uint8_t i;

    mCrc = mCrc ^ static_cast<uint16_t>(aByte << 8);
    i    = 8;

    do
    {
        if (mCrc & 0x8000)
        {
            mCrc = static_cast<uint16_t>(mCrc << 1) ^ mPolynomial;
        }
        else
        {
            mCrc = static_cast<uint16_t>(mCrc << 1);
        }
    } while (--i);
}